

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O3

TString * luaS_newlstr(lua_State *L,char *str,size_t l)

{
  lu_int32 *plVar1;
  uint uVar2;
  global_State *pgVar3;
  byte bVar4;
  int iVar5;
  GCObject *pGVar6;
  size_t sVar7;
  uint uVar8;
  ulong uVar9;
  GCObject **local_38;
  
  if (l < 0x29) {
    pgVar3 = L->l_G;
    uVar8 = pgVar3->seed ^ (uint)l;
    if (l != 0) {
      sVar7 = l;
      do {
        uVar8 = uVar8 ^ (uint)(byte)str[sVar7 - 1] + (uVar8 >> 2) + uVar8 * 0x20;
        sVar7 = sVar7 + ~(l >> 5);
      } while (l >> 5 < sVar7);
    }
    local_38 = (pgVar3->strt).hash;
    uVar2 = (pgVar3->strt).size;
    uVar9 = (ulong)(int)(uVar2 - 1 & uVar8);
    for (pGVar6 = local_38[uVar9]; pGVar6 != (GCObject *)0x0; pGVar6 = (pGVar6->gch).next) {
      if (((uVar8 == (pGVar6->h).sizearray) && ((pGVar6->h).array == (TValue *)l)) &&
         (iVar5 = bcmp(str,&(pGVar6->h).node,l), iVar5 == 0)) {
        bVar4 = (pGVar6->gch).marked ^ 3;
        if (((pgVar3->currentwhite ^ 3) & bVar4) != 0) {
          return (TString *)pGVar6;
        }
        (pGVar6->gch).marked = bVar4;
        return (TString *)pGVar6;
      }
    }
    if (((int)uVar2 < 0x3fffffff) && (uVar2 <= (pgVar3->strt).nuse)) {
      luaS_resize(L,uVar2 * 2);
      local_38 = (pgVar3->strt).hash;
      uVar9 = (long)(int)uVar8 & (long)(pgVar3->strt).size - 1U;
    }
    pGVar6 = luaC_newobj(L,4,l + 0x19,local_38 + uVar9,0);
    (pGVar6->h).array = (TValue *)l;
    (pGVar6->h).sizearray = uVar8;
    (pGVar6->h).flags = '\0';
    memcpy(&(pGVar6->h).node,str,l);
    *(undefined1 *)((long)pGVar6 + l + 0x18) = 0;
    plVar1 = &(pgVar3->strt).nuse;
    *plVar1 = *plVar1 + 1;
  }
  else {
    if (l + 0x1b < 0x1a) {
      luaM_toobig(L);
    }
    uVar8 = L->l_G->seed;
    pGVar6 = luaC_newobj(L,0x14,l + 0x19,(GCObject **)0x0,0);
    (pGVar6->h).array = (TValue *)l;
    (pGVar6->h).sizearray = uVar8;
    (pGVar6->h).flags = '\0';
    memcpy(&(pGVar6->h).node,str,l);
    *(undefined1 *)((long)pGVar6 + l + 0x18) = 0;
  }
  return (TString *)pGVar6;
}

Assistant:

TString *luaS_newlstr (lua_State *L, const char *str, size_t l) {
  if (l <= LUAI_MAXSHORTLEN)  /* short string? */
    return internshrstr(L, str, l);
  else {
    if (l + 1 > (MAX_SIZET - sizeof(TString))/sizeof(char))
      luaM_toobig(L);
    return createstrobj(L, str, l, LUA_TLNGSTR, G(L)->seed, NULL);
  }
}